

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

float * stbir__decode_uint16_linear_AR(float *decodep,int width_times_channels,void *inputp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  float *pfVar3;
  ushort *in_RDX;
  int in_ESI;
  float *in_RDI;
  bool bVar4;
  ushort *local_130;
  float *local_120;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  __m128i zero;
  __m128 of1;
  __m128 of0;
  __m128i o1;
  __m128i o0;
  __m128i i;
  unsigned_short *end_input_m8;
  unsigned_short *input;
  float *decode_end;
  float *decode;
  
  pfVar3 = in_RDI + in_ESI;
  if (in_ESI < 8) {
    local_130 = in_RDX;
    for (local_120 = in_RDI + 4; local_120 <= pfVar3; local_120 = local_120 + 4) {
      local_120[-4] = (float)local_130[1];
      local_120[-3] = (float)*local_130;
      local_120[-2] = (float)local_130[3];
      local_120[-1] = (float)local_130[2];
      local_130 = local_130 + 4;
    }
    for (local_120 = local_120 + -4; local_120 < pfVar3; local_120 = local_120 + 2) {
      *local_120 = (float)local_130[1];
      local_120[1] = (float)*local_130;
      local_130 = local_130 + 2;
    }
  }
  else {
    local_130 = in_RDX;
    local_120 = in_RDI;
    do {
      do {
        uVar1 = *(undefined8 *)local_130;
        uVar2 = *(undefined8 *)(local_130 + 4);
        local_a8 = (ushort)uVar1;
        uStack_a6 = (ushort)((ulong)uVar1 >> 0x10);
        uStack_a4 = (ushort)((ulong)uVar1 >> 0x20);
        uStack_a2 = (ushort)((ulong)uVar1 >> 0x30);
        o1[0]._0_2_ = (ushort)uVar2;
        o1[0]._2_2_ = (ushort)((ulong)uVar2 >> 0x10);
        o1[0]._4_2_ = (ushort)((ulong)uVar2 >> 0x20);
        o1[0]._6_2_ = (ushort)((ulong)uVar2 >> 0x30);
        input._4_4_ = (uint)uStack_a6;
        decode_end._4_4_ = (uint)uStack_a2;
        i[1]._6_2_ = 0;
        i[1]._4_2_ = o1[0]._2_2_;
        end_input_m8._4_4_ = (uint)o1[0]._6_2_;
        *(ulong *)local_120 = CONCAT44((float)local_a8,(float)input._4_4_);
        *(ulong *)(local_120 + 2) = CONCAT44((float)uStack_a4,(float)decode_end._4_4_);
        *(ulong *)(local_120 + 4) = CONCAT44((float)(ushort)o1[0],(float)i[1]._4_4_);
        *(ulong *)(local_120 + 6) = CONCAT44((float)o1[0]._4_2_,(float)end_input_m8._4_4_);
        local_120 = local_120 + 8;
        local_130 = local_130 + 8;
      } while (local_120 <= pfVar3 + -8);
      bVar4 = local_120 != pfVar3;
      local_130 = in_RDX + (long)in_ESI + -8;
      local_120 = pfVar3 + -8;
    } while (bVar4);
  }
  return pfVar3;
}

Assistant:

static float * STBIR__CODER_NAME(stbir__decode_uint16_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  unsigned short const * input = (unsigned short const *)inputp;

  #ifdef STBIR_SIMD
  unsigned short const * end_input_m8 = input + width_times_channels - 8;
  if ( width_times_channels >= 8 )
  {
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      #ifdef STBIR_SIMD8
      stbir__simdi i; stbir__simdi8 o;
      stbir__simdf8 of;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi8_expand_u16_to_u32( o, i );
      stbir__simdi8_convert_i32_to_float( of, o );
      stbir__decode_simdf8_flip( of );
      stbir__simdf8_store( decode + 0, of );
      #else
      stbir__simdi i, o0, o1;
      stbir__simdf of0, of1;
      STBIR_NO_UNROLL(decode);
      stbir__simdi_load( i, input );
      stbir__simdi_expand_u16_to_u32( o0, o1, i );
      stbir__simdi_convert_i32_to_float( of0, o0 );
      stbir__simdi_convert_i32_to_float( of1, o1 );
      stbir__decode_simdf4_flip( of0 );
      stbir__decode_simdf4_flip( of1 );
      stbir__simdf_store( decode + 0,  of0 );
      stbir__simdf_store( decode + 4,  of1 );
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return decode_end + 8;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = ((float)(input[stbir__decode_order0]));
    decode[1-4] = ((float)(input[stbir__decode_order1]));
    decode[2-4] = ((float)(input[stbir__decode_order2]));
    decode[3-4] = ((float)(input[stbir__decode_order3]));
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = ((float)(input[stbir__decode_order0]));
    #if stbir__coder_min_num >= 2
    decode[1] = ((float)(input[stbir__decode_order1]));
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = ((float)(input[stbir__decode_order2]));
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
  return decode_end;
}